

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

int __thiscall GGSock::Communicator::listen(Communicator *this,int __fd,int __n)

{
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> this_00;
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  undefined8 in_RAX;
  undefined7 extraout_var;
  int in_ECX;
  int iVar6;
  sockaddr *__addr;
  TSocketDescriptor *sock;
  int enable;
  undefined8 uStack_38;
  
  this_00._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  uStack_38 = in_RAX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&(this_00._M_head_impl)->mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (((this_00._M_head_impl)->isConnected == false) &&
     ((this_00._M_head_impl)->isListening == false)) {
    sock = &(this_00._M_head_impl)->sd;
    anon_unknown.dwarf_783c::closeAndReset(sock);
    iVar4 = 1;
    iVar3 = socket(2,1,6);
    *sock = iVar3;
    if (iVar3 < 0) {
      anon_unknown.dwarf_783c::closeAndReset(sock);
      listen((int)sock,iVar4);
    }
    else {
      uStack_38 = CONCAT44(1,(undefined4)uStack_38);
      iVar6 = 1;
      iVar4 = setsockopt(iVar3,1,2,(void *)((long)&uStack_38 + 4),4);
      if (iVar4 < 0) {
        listen(iVar3,iVar6);
      }
      iVar3 = *sock;
      iVar6 = 1;
      iVar4 = setsockopt(iVar3,1,0xf,(void *)((long)&uStack_38 + 4),4);
      if (iVar4 < 0) {
        listen(iVar3,iVar6);
      }
      __addr = (sockaddr *)&(this_00._M_head_impl)->addr;
      ((this_00._M_head_impl)->addr).sin_family = 0;
      ((this_00._M_head_impl)->addr).sin_port = 0;
      ((this_00._M_head_impl)->addr).sin_addr = 0;
      puVar1 = (uchar *)((long)&(this_00._M_head_impl)->addr + 8);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      ((this_00._M_head_impl)->addr).sin_family = 2;
      ((in_addr *)((long)&(this_00._M_head_impl)->addr + 4))->s_addr = 0;
      *(ushort *)((long)&(this_00._M_head_impl)->addr + 2) = (ushort)__fd << 8 | (ushort)__fd >> 8;
      iVar3 = (this_00._M_head_impl)->sd;
      iVar4 = bind(iVar3,__addr,0x10);
      if (iVar4 == -1) {
        listen(iVar3,(int)__addr);
      }
      else {
        iVar3 = *sock;
        iVar4 = ::listen(iVar3,in_ECX);
        if (iVar4 != -1) {
          anon_unknown.dwarf_783c::setNonBlocking(sock);
          (this_00._M_head_impl)->isServer = true;
          (this_00._M_head_impl)->isListening = true;
          iVar5 = 0;
          if (0 < __n) {
            iVar5 = __n;
          }
          (this_00._M_head_impl)->timeoutListen_ms = iVar5;
          if (__n < 1) {
            iVar3 = (int)CONCAT71((uint7)(uint3)((uint)__n >> 8),1);
            if (-1 < __n) goto LAB_0010a1d7;
            (this_00._M_head_impl)->timeoutListen_ms = 1;
            do {
              if ((this_00._M_head_impl)->isListening != true) goto LAB_0010a1d5;
              bVar2 = Data::doListen(this_00._M_head_impl);
            } while (!bVar2);
          }
          else {
            bVar2 = Data::doListen(this_00._M_head_impl);
            iVar3 = (int)CONCAT71(extraout_var,bVar2);
          }
          (this_00._M_head_impl)->isListening = false;
          goto LAB_0010a1d7;
        }
        listen(iVar3,in_ECX);
      }
    }
  }
LAB_0010a1d5:
  iVar3 = 0;
LAB_0010a1d7:
  pthread_mutex_unlock((pthread_mutex_t *)&(this_00._M_head_impl)->mutex);
  return iVar3;
}

Assistant:

bool Communicator::listen(TPort port, int32_t timeout_ms, int32_t maxConnections) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.isConnected) return false;
        if (data.isListening) return false;

        ::closeAndReset(data.sd);

        data.sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        if (data.sd < 0) {
            ::closeAndReset(data.sd);
            fprintf(stderr, "Error creating socket (%d %s)\n", errno, strerror(errno));
            return false;
        }

        int enable = 1;
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
        }

#ifndef _WIN32
        if (setsockopt(data.sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
        }
#endif

        //{
        //    linger lin;
        //    lin.l_onoff = 0;
        //    lin.l_linger = 0;
        //    if (setsockopt(data.sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
        //    }
        //}

        auto & addr = data.addr;

        memset(&addr, 0, sizeof(addr));
        addr.sin_family = AF_INET;
        addr.sin_addr.s_addr = INADDR_ANY;
        addr.sin_port = htons(port);

        int res = bind(data.sd, (struct sockaddr *)&addr, sizeof(addr));
        if (res == -1) {
            perror("Bind failed");
            fprintf(stderr, "Error: bind failed");
            return false;
        }

        res = ::listen(data.sd, maxConnections);
        if (res == -1) {
            fprintf(stderr, "Error: listen failed");
            return false;
        }

        ::setNonBlocking(data.sd);

        data.isServer = true;
        data.isListening = true;

        data.timeoutListen_ms = (std::max)(0, timeout_ms);
        if (timeout_ms > 0) {
            bool success = data.doListen();

            data.isListening = false;
            return success;
        } else if (timeout_ms < 0) {
            data.timeoutListen_ms = 1;
            while (data.isListening) {
                bool success = data.doListen();
                if (success) {
                    data.isListening = false;
                    return true;
                }
            }
            return false;
        }

        return true;
    }